

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

void __thiscall MT32Emu::Partial::Partial(Partial *this,Synth *useSynth,int usePartialIndex)

{
  RendererType RVar1;
  TVA *this_00;
  TVP *this_01;
  TVF *this_02;
  LA32IntPartialPair *this_03;
  LA32FloatPartialPair *this_04;
  int usePartialIndex_local;
  Synth *useSynth_local;
  Partial *this_local;
  
  this->synth = useSynth;
  this->partialIndex = usePartialIndex;
  this->sampleNum = 0;
  LA32Ramp::LA32Ramp(&this->ampRamp);
  LA32Ramp::LA32Ramp(&this->cutoffModifierRamp);
  RVar1 = Synth::getSelectedRendererType(useSynth);
  this->floatMode = RVar1 == RendererType_FLOAT;
  this_00 = (TVA *)operator_new(0x48);
  TVA::TVA(this_00,this,&this->ampRamp);
  this->tva = this_00;
  this_01 = (TVP *)operator_new(0x58);
  TVP::TVP(this_01,this);
  this->tvp = this_01;
  this_02 = (TVF *)operator_new(0x30);
  TVF::TVF(this_02,this,&this->cutoffModifierRamp);
  this->tvf = this_02;
  this->ownerPart = -1;
  this->poly = (Poly *)0x0;
  this->pair = (Partial *)0x0;
  RVar1 = Synth::getSelectedRendererType(this->synth);
  if (RVar1 == RendererType_BIT16S) {
    this_03 = (LA32IntPartialPair *)operator_new(0xd0);
    LA32IntPartialPair::LA32IntPartialPair(this_03);
    this->la32Pair = (LA32PartialPair *)this_03;
  }
  else if (RVar1 == RendererType_FLOAT) {
    this_04 = (LA32FloatPartialPair *)operator_new(0x68);
    LA32FloatPartialPair::LA32FloatPartialPair(this_04);
    this->la32Pair = (LA32PartialPair *)this_04;
  }
  else {
    this->la32Pair = (LA32PartialPair *)0x0;
  }
  return;
}

Assistant:

Partial::Partial(Synth *useSynth, int usePartialIndex) :
	synth(useSynth), partialIndex(usePartialIndex), sampleNum(0),
	floatMode(useSynth->getSelectedRendererType() == RendererType_FLOAT) {
	// Initialisation of tva, tvp and tvf uses 'this' pointer
	// and thus should not be in the initializer list to avoid a compiler warning
	tva = new TVA(this, &ampRamp);
	tvp = new TVP(this);
	tvf = new TVF(this, &cutoffModifierRamp);
	ownerPart = -1;
	poly = NULL;
	pair = NULL;
	switch (synth->getSelectedRendererType()) {
	case RendererType_BIT16S:
		la32Pair = new LA32IntPartialPair;
		break;
	case RendererType_FLOAT:
		la32Pair = new LA32FloatPartialPair;
		break;
	default:
		la32Pair = NULL;
	}
}